

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_cfg_analysis.cpp
# Opt level: O3

void __thiscall
spvtools::opt::StructuredCFGAnalysis::StructuredCFGAnalysis
          (StructuredCFGAnalysis *this,IRContext *ctx)

{
  IRContext *this_00;
  _Head_base<0UL,_spvtools::opt::Module_*,_false> _Var1;
  pointer puVar2;
  bool bVar3;
  pointer puVar4;
  FeatureManager *pFVar5;
  pointer puVar6;
  
  this->context_ = ctx;
  (this->bb_to_construct_)._M_h._M_buckets = &(this->bb_to_construct_)._M_h._M_single_bucket;
  (this->bb_to_construct_)._M_h._M_bucket_count = 1;
  (this->bb_to_construct_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->bb_to_construct_)._M_h._M_element_count = 0;
  (this->bb_to_construct_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->bb_to_construct_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->bb_to_construct_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->merge_blocks_).bits_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->merge_blocks_).bits_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->merge_blocks_).bits_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar4 = (pointer)operator_new(0x80);
  (this->merge_blocks_).bits_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = puVar4;
  (this->merge_blocks_).bits_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = puVar4 + 0x10;
  *puVar4 = 0;
  puVar4[1] = 0;
  puVar4[2] = 0;
  puVar4[3] = 0;
  puVar4[4] = 0;
  puVar4[5] = 0;
  puVar4[6] = 0;
  puVar4[7] = 0;
  puVar4[8] = 0;
  puVar4[9] = 0;
  puVar4[10] = 0;
  puVar4[0xb] = 0;
  puVar4[0xc] = 0;
  puVar4[0xd] = 0;
  puVar4[0xe] = 0;
  puVar4[0xf] = 0;
  (this->merge_blocks_).bits_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = puVar4 + 0x10;
  this_00 = this->context_;
  pFVar5 = (this_00->feature_mgr_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
           .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
  if (pFVar5 == (FeatureManager *)0x0) {
    IRContext::AnalyzeFeatures(this_00);
    pFVar5 = (this_00->feature_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
             .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
  }
  bVar3 = EnumSet<spv::Capability>::contains(&pFVar5->capabilities_,Shader);
  if (bVar3) {
    _Var1._M_head_impl =
         (this->context_->module_)._M_t.
         super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>.
         _M_t.
         super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
         .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
    puVar2 = *(pointer *)((long)&(_Var1._M_head_impl)->functions_ + 8);
    for (puVar6 = *(pointer *)
                   &((_Var1._M_head_impl)->functions_).
                    super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
        ; puVar6 != puVar2; puVar6 = puVar6 + 1) {
      AddBlocksInFunction(this,(Function *)puVar6->_M_t);
    }
  }
  return;
}

Assistant:

StructuredCFGAnalysis::StructuredCFGAnalysis(IRContext* ctx) : context_(ctx) {
  // If this is not a shader, there are no merge instructions, and not
  // structured CFG to analyze.
  if (!context_->get_feature_mgr()->HasCapability(spv::Capability::Shader)) {
    return;
  }

  for (auto& func : *context_->module()) {
    AddBlocksInFunction(&func);
  }
}